

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Node * create_lvar_init(C_Parser *parser,Initializer *init,C_Type *ty,InitDesg *desg,C_Token *tok)

{
  C_Node *pCVar1;
  C_Obj *local_e0;
  C_Node *lhs;
  InitDesg desg2_2;
  C_Member *mem_1;
  C_Node *rhs_1;
  InitDesg desg2_1;
  C_Member *mem;
  C_Node *node_1;
  C_Node *rhs;
  InitDesg desg2;
  C_Parser *pCStack_40;
  int i;
  C_Node *node;
  C_Token *tok_local;
  InitDesg *desg_local;
  C_Type *ty_local;
  Initializer *init_local;
  C_Parser *parser_local;
  
  if (ty->kind == TY_ARRAY) {
    pCStack_40 = (C_Parser *)new_node(parser,ND_NULL_EXPR,tok);
    for (desg2.var._4_4_ = 0; desg2.var._4_4_ < ty->array_len; desg2.var._4_4_ = desg2.var._4_4_ + 1
        ) {
      desg2.next._0_4_ = desg2.var._4_4_;
      desg2.idx = 0;
      desg2._12_4_ = 0;
      desg2.member = (C_Member *)0x0;
      rhs = (C_Node *)desg;
      pCVar1 = create_lvar_init(parser,init->children[desg2.var._4_4_],ty->base,(InitDesg *)&rhs,tok
                               );
      pCStack_40 = (C_Parser *)new_binary(parser,ND_COMMA,(C_Node *)pCStack_40,pCVar1,tok);
    }
    parser_local = pCStack_40;
  }
  else if ((ty->kind == TY_STRUCT) && (init->expr == (C_Node *)0x0)) {
    mem = (C_Member *)new_node(parser,ND_NULL_EXPR,tok);
    for (desg2_1.var = (C_Obj *)ty->members; desg2_1.var != (C_Obj *)0x0;
        desg2_1.var = (desg2_1.var)->next) {
      desg2_1.next._0_4_ = 0;
      desg2_1._8_8_ = desg2_1.var;
      desg2_1.member = (C_Member *)0x0;
      rhs_1 = (C_Node *)desg;
      pCVar1 = create_lvar_init(parser,init->children[*(int *)&(desg2_1.var)->is_local],
                                (C_Type *)(desg2_1.var)->name,(InitDesg *)&rhs_1,tok);
      mem = (C_Member *)new_binary(parser,ND_COMMA,(C_Node *)mem,pCVar1,tok);
    }
    parser_local = (C_Parser *)mem;
  }
  else if (ty->kind == TY_UNION) {
    if (init->mem == (C_Member *)0x0) {
      local_e0 = (C_Obj *)ty->members;
    }
    else {
      local_e0 = (C_Obj *)init->mem;
    }
    desg2_2.var = local_e0;
    desg2_2.next._0_4_ = 0;
    desg2_2._8_8_ = local_e0;
    desg2_2.member = (C_Member *)0x0;
    lhs = (C_Node *)desg;
    parser_local = (C_Parser *)
                   create_lvar_init(parser,init->children[*(int *)&local_e0->is_local],
                                    (C_Type *)local_e0->name,(InitDesg *)&lhs,tok);
  }
  else if (init->expr == (C_Node *)0x0) {
    parser_local = (C_Parser *)new_node(parser,ND_NULL_EXPR,tok);
  }
  else {
    pCVar1 = init_desg_expr(parser,desg,tok);
    parser_local = (C_Parser *)new_binary(parser,ND_ASSIGN,pCVar1,init->expr,tok);
  }
  return (C_Node *)parser_local;
}

Assistant:

static C_Node *create_lvar_init(C_Parser *parser, Initializer *init, C_Type *ty, InitDesg *desg, C_Token *tok) {
  if (ty->kind == TY_ARRAY) {
    C_Node *node = new_node(parser, ND_NULL_EXPR, tok);
    for (int i = 0; i < ty->array_len; i++) {
      InitDesg desg2 = {desg, i};
      C_Node *rhs = create_lvar_init(parser, init->children[i], ty->base, &desg2, tok);
      node = new_binary(parser, ND_COMMA, node, rhs, tok);
    }
    return node;
  }

  if (ty->kind == TY_STRUCT && !init->expr) {
    C_Node *node = new_node(parser, ND_NULL_EXPR, tok);

    for (C_Member *mem = ty->members; mem; mem = mem->next) {
      InitDesg desg2 = {desg, 0, mem};
      C_Node *rhs = create_lvar_init(parser, init->children[mem->idx], mem->ty, &desg2, tok);
      node = new_binary(parser, ND_COMMA, node, rhs, tok);
    }
    return node;
  }

  if (ty->kind == TY_UNION) {
    C_Member *mem = init->mem ? init->mem : ty->members;
    InitDesg desg2 = {desg, 0, mem};
    return create_lvar_init(parser, init->children[mem->idx], mem->ty, &desg2, tok);
  }

  if (!init->expr)
    return new_node(parser, ND_NULL_EXPR, tok);

  C_Node *lhs = init_desg_expr(parser, desg, tok);
  return new_binary(parser, ND_ASSIGN, lhs, init->expr, tok);
}